

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# secp256k1.c
# Opt level: O1

int secp256k1_ecdsa_sign_inner
              (secp256k1_context *ctx,secp256k1_scalar *r,secp256k1_scalar *s,int *recid,
              uchar *msg32,uchar *seckey,secp256k1_nonce_function noncefp,void *noncedata)

{
  ulong uVar1;
  undefined1 auVar2 [16];
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  uint64_t uVar10;
  uint64_t uVar11;
  uint64_t uVar12;
  bool bVar13;
  uint uVar14;
  int iVar15;
  uint64_t uVar16;
  ulong uVar17;
  uint uVar18;
  long lVar19;
  uint uVar20;
  uint uVar21;
  uint64_t uVar22;
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  secp256k1_scalar non;
  int overflow;
  secp256k1_ge r_1;
  secp256k1_scalar msg;
  secp256k1_scalar sec;
  secp256k1_scalar n;
  uchar nonce32 [32];
  uchar b [32];
  uint local_24c;
  uint local_248;
  int local_244;
  secp256k1_scalar *local_240;
  uint *local_238;
  secp256k1_context *local_230;
  uint local_224;
  uchar *local_220;
  uchar *local_218;
  secp256k1_modinv64_signed62 local_210;
  secp256k1_scalar local_1e8;
  undefined1 local_1c8 [16];
  undefined1 local_1b8 [16];
  undefined1 local_1a8 [16];
  undefined1 local_198 [16];
  undefined1 local_188 [16];
  undefined1 local_178 [16];
  undefined1 local_168 [16];
  undefined1 local_158 [16];
  secp256k1_nonce_function local_140;
  undefined1 local_138 [16];
  undefined1 local_128 [16];
  undefined1 local_118 [16];
  undefined1 local_108 [16];
  undefined1 local_f8 [16];
  undefined8 local_e8;
  secp256k1_scalar local_d8;
  secp256k1_scalar local_b8;
  undefined1 local_98 [16];
  undefined1 local_88 [16];
  uchar local_78 [32];
  uchar local_58 [40];
  
  local_24c = 0;
  r->d[2] = 0;
  r->d[3] = 0;
  r->d[0] = 0;
  r->d[1] = 0;
  s->d[2] = 0;
  s->d[3] = 0;
  s->d[0] = 0;
  s->d[1] = 0;
  if (recid != (int *)0x0) {
    *recid = 0;
  }
  local_140 = nonce_function_rfc6979;
  if (noncefp != (secp256k1_nonce_function)0x0) {
    local_140 = noncefp;
  }
  local_240 = r;
  local_238 = (uint *)recid;
  local_230 = ctx;
  local_220 = msg32;
  local_218 = seckey;
  secp256k1_scalar_set_b32(&local_b8,seckey,(int *)local_1c8);
  local_224 = (uint)(((local_b8.d[2] != 0 || local_b8.d[3] != 0) ||
                     (local_b8.d[1] != 0 || local_b8.d[0] != 0)) && local_1c8._0_4_ == 0);
  uVar14 = local_224 ^ 1;
  local_1c8._0_4_ = uVar14;
  uVar1 = (long)(int)uVar14 - 1;
  local_b8.d[1] = local_b8.d[1] & uVar1;
  local_b8.d[0] = (ulong)uVar14 | local_b8.d[0] & uVar1;
  local_b8.d[3] = uVar1 & local_b8.d[3];
  local_b8.d[2] = local_b8.d[2] & uVar1;
  uVar22 = 0;
  secp256k1_scalar_set_b32(&local_d8,local_220,(int *)0x0);
  uVar14 = 0;
  do {
    bVar13 = false;
    iVar15 = (*local_140)(local_78,local_220,local_218,(uchar *)0x0,noncedata,uVar14);
    local_24c = (uint)(iVar15 != 0);
    if (iVar15 != 0) {
      secp256k1_scalar_set_b32(&local_1e8,local_78,(int *)local_1c8);
      local_248 = (uint)(((local_1e8.d[3] != 0 || local_1e8.d[1] != 0) ||
                         (local_1e8.d[2] != 0 || local_1e8.d[0] != 0)) && local_1c8._0_4_ == 0);
      if (local_230->declassify != 0) {
        local_1c8._8_8_ = &local_248;
        local_1c8._0_8_ = 0x4d430002;
        local_1b8 = ZEXT816(4);
        local_1a8 = ZEXT816(0);
        auVar2._8_8_ = 0;
        auVar2._0_8_ = local_138._8_8_;
        local_138 = auVar2 << 0x40;
      }
      if (local_248 != 0) {
        local_244 = 0;
        secp256k1_ecmult_gen(&local_230->ecmult_gen_ctx,(secp256k1_gej *)local_1c8,&local_1e8);
        secp256k1_ge_set_gej((secp256k1_ge *)local_138,(secp256k1_gej *)local_1c8);
        secp256k1_fe_impl_normalize((secp256k1_fe *)local_138);
        secp256k1_fe_impl_normalize((secp256k1_fe *)(local_118 + 8));
        secp256k1_fe_impl_get_b32(local_58,(secp256k1_fe *)local_138);
        secp256k1_scalar_set_b32(local_240,local_58,&local_244);
        if (local_238 != (uint *)0x0) {
          *local_238 = (local_118._8_4_ & 1) + local_244 * 2;
        }
        secp256k1_scalar_mul((secp256k1_scalar *)local_98,local_240,&local_b8);
        secp256k1_scalar_add((secp256k1_scalar *)local_98,(secp256k1_scalar *)local_98,&local_d8);
        local_210.v[0] = local_1e8.d[0] & 0x3fffffffffffffff;
        local_210.v[1] = (local_1e8.d[1] & 0xfffffffffffffff) << 2 | local_1e8.d[0] >> 0x3e;
        local_210.v[2] = (local_1e8.d[2] & 0x3ffffffffffffff) << 4 | local_1e8.d[1] >> 0x3c;
        local_210.v[3] = (local_1e8.d[3] & 0xffffffffffffff) << 6 | local_1e8.d[2] >> 0x3a;
        local_210.v[4] = local_1e8.d[3] >> 0x38;
        secp256k1_modinv64(&local_210,&secp256k1_const_modinfo_scalar);
        s->d[0] = local_210.v[1] << 0x3e | local_210.v[0];
        s->d[1] = local_210.v[2] << 0x3c | (ulong)local_210.v[1] >> 2;
        s->d[2] = local_210.v[3] << 0x3a | (ulong)local_210.v[2] >> 4;
        s->d[3] = local_210.v[4] << 0x38 | (ulong)local_210.v[3] >> 6;
        secp256k1_scalar_mul(s,s,(secp256k1_scalar *)local_98);
        local_88 = (undefined1  [16])0x0;
        local_98 = (undefined1  [16])0x0;
        local_158 = (undefined1  [16])0x0;
        local_168 = (undefined1  [16])0x0;
        local_178 = (undefined1  [16])0x0;
        local_188 = (undefined1  [16])0x0;
        local_198 = (undefined1  [16])0x0;
        local_1a8 = (undefined1  [16])0x0;
        local_1b8 = (undefined1  [16])0x0;
        local_1c8 = (undefined1  [16])0x0;
        local_e8._0_4_ = 0;
        local_e8._4_4_ = 0;
        local_f8 = (undefined1  [16])0x0;
        local_108 = (undefined1  [16])0x0;
        local_118 = (undefined1  [16])0x0;
        local_128 = (undefined1  [16])0x0;
        local_138 = (undefined1  [16])0x0;
        uVar1 = s->d[3];
        uVar3 = s->d[2];
        uVar20 = (uint)(uVar1 >> 0x3f);
        uVar21 = uVar20 ^ 1;
        uVar18 = uVar21;
        if (uVar3 == 0xffffffffffffffff) {
          uVar18 = 0;
        }
        uVar4 = s->d[1];
        if (0x5d576e7357a4501c < uVar4) {
          uVar21 = 0;
        }
        uVar5 = s->d[0];
        uVar21 = (uVar21 | uVar18 | uVar1 < 0x7fffffffffffffff) ^ 1;
        uVar18 = 0;
        if (0xdfe92f46681b20a0 < uVar5) {
          uVar18 = uVar21;
        }
        if (0x5d576e7357a4501d < uVar4) {
          uVar18 = uVar21;
        }
        uVar18 = uVar18 | uVar20;
        local_210.v[0] = CONCAT44(local_210.v[0]._4_4_,uVar18);
        uVar17 = -(long)(int)uVar18;
        uVar6 = (ulong)CARRY8(uVar17 & 0xbfd25e8cd0364142,uVar5 ^ uVar17);
        uVar8 = (uVar17 & 0xbaaedce6af48a03b) + (uVar4 ^ uVar17);
        uVar7 = (ulong)(CARRY8(uVar17 & 0xbaaedce6af48a03b,uVar4 ^ uVar17) || CARRY8(uVar8,uVar6));
        uVar9 = (uVar17 & 0xfffffffffffffffe) + (uVar3 ^ uVar17);
        uVar16 = ((uVar1 ^ uVar17) - (long)(int)uVar18) +
                 (ulong)(CARRY8(uVar17 & 0xfffffffffffffffe,uVar3 ^ uVar17) || CARRY8(uVar9,uVar7));
        uVar10 = uVar8 + uVar6;
        uVar11 = (uVar17 & 0xbfd25e8cd0364142) + (uVar5 ^ uVar17);
        uVar12 = uVar9 + uVar7;
        if (((uVar3 == 0 && uVar1 == 0) && uVar4 == 0) && uVar5 == 0) {
          uVar16 = uVar22;
          uVar10 = uVar22;
          uVar11 = uVar22;
          uVar12 = uVar22;
        }
        s->d[0] = uVar11;
        s->d[1] = uVar10;
        s->d[2] = uVar12;
        s->d[3] = uVar16;
        if (local_238 != (uint *)0x0) {
          *local_238 = *local_238 ^ uVar18;
        }
        local_24c = (uint)((((uVar10 != 0 || uVar11 != 0) || uVar12 != 0) || uVar16 != 0) &&
                          ((local_240->d[3] != 0 || local_240->d[1] != 0) ||
                          (local_240->d[2] != 0 || local_240->d[0] != 0)));
        if (local_230->declassify != 0) {
          local_1c8._8_8_ = &local_24c;
          local_1c8._0_8_ = 0x4d430002;
          local_1b8 = ZEXT816(4);
          local_1a8 = ZEXT816(0);
          local_138 = ZEXT816(0) << 0x40;
        }
        if (local_24c != 0) {
          bVar13 = false;
          goto LAB_00b4c895;
        }
      }
      uVar14 = uVar14 + 1;
      bVar13 = true;
    }
LAB_00b4c895:
    if (!bVar13) {
      uVar14 = (uint)((local_24c & local_224) == 0);
      lVar19 = (long)(int)uVar14 + -1;
      auVar23._8_4_ = (int)lVar19;
      auVar23._0_8_ = lVar19;
      auVar23._12_4_ = (int)((ulong)lVar19 >> 0x20);
      auVar2 = *(undefined1 (*) [16])(local_240->d + 2);
      *(undefined1 (*) [16])local_240->d = *(undefined1 (*) [16])local_240->d & auVar23;
      *(undefined1 (*) [16])(local_240->d + 2) = auVar2 & auVar23;
      lVar19 = (long)(int)uVar14 + -1;
      auVar24._8_4_ = (int)lVar19;
      auVar24._0_8_ = lVar19;
      auVar24._12_4_ = (int)((ulong)lVar19 >> 0x20);
      auVar2 = *(undefined1 (*) [16])(s->d + 2);
      *(undefined1 (*) [16])s->d = *(undefined1 (*) [16])s->d & auVar24;
      *(undefined1 (*) [16])(s->d + 2) = auVar2 & auVar24;
      if (local_238 != (uint *)0x0) {
        *local_238 = *local_238 & uVar14 - 1;
      }
      return local_24c & local_224;
    }
  } while( true );
}

Assistant:

static int secp256k1_ecdsa_sign_inner(const secp256k1_context* ctx, secp256k1_scalar* r, secp256k1_scalar* s, int* recid, const unsigned char *msg32, const unsigned char *seckey, secp256k1_nonce_function noncefp, const void* noncedata) {
    secp256k1_scalar sec, non, msg;
    int ret = 0;
    int is_sec_valid;
    unsigned char nonce32[32];
    unsigned int count = 0;
    /* Default initialization here is important so we won't pass uninit values to the cmov in the end */
    *r = secp256k1_scalar_zero;
    *s = secp256k1_scalar_zero;
    if (recid) {
        *recid = 0;
    }
    if (noncefp == NULL) {
        noncefp = secp256k1_nonce_function_default;
    }

    /* Fail if the secret key is invalid. */
    is_sec_valid = secp256k1_scalar_set_b32_seckey(&sec, seckey);
    secp256k1_scalar_cmov(&sec, &secp256k1_scalar_one, !is_sec_valid);
    secp256k1_scalar_set_b32(&msg, msg32, NULL);
    while (1) {
        int is_nonce_valid;
        ret = !!noncefp(nonce32, msg32, seckey, NULL, (void*)noncedata, count);
        if (!ret) {
            break;
        }
        is_nonce_valid = secp256k1_scalar_set_b32_seckey(&non, nonce32);
        /* The nonce is still secret here, but it being invalid is less likely than 1:2^255. */
        secp256k1_declassify(ctx, &is_nonce_valid, sizeof(is_nonce_valid));
        if (is_nonce_valid) {
            ret = secp256k1_ecdsa_sig_sign(&ctx->ecmult_gen_ctx, r, s, &sec, &msg, &non, recid);
            /* The final signature is no longer a secret, nor is the fact that we were successful or not. */
            secp256k1_declassify(ctx, &ret, sizeof(ret));
            if (ret) {
                break;
            }
        }
        count++;
    }
    /* We don't want to declassify is_sec_valid and therefore the range of
     * seckey. As a result is_sec_valid is included in ret only after ret was
     * used as a branching variable. */
    ret &= is_sec_valid;
    secp256k1_memclear(nonce32, sizeof(nonce32));
    secp256k1_scalar_clear(&msg);
    secp256k1_scalar_clear(&non);
    secp256k1_scalar_clear(&sec);
    secp256k1_scalar_cmov(r, &secp256k1_scalar_zero, !ret);
    secp256k1_scalar_cmov(s, &secp256k1_scalar_zero, !ret);
    if (recid) {
        const int zero = 0;
        secp256k1_int_cmov(recid, &zero, !ret);
    }
    return ret;
}